

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

Result * CoreML::validateFeatureDescriptions<CoreML::Specification::ModelDescription>
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar3;
  reference pFVar4;
  FeatureDescription *state;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_2;
  FeatureDescription *output;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_1;
  FeatureDescription *input;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  ValidationPolicy *local_28;
  ValidationPolicy *validationPolicy_local;
  ModelDescription *pMStack_18;
  int modelVersion_local;
  ModelDescription *interface_local;
  Result *r;
  
  local_28 = validationPolicy;
  validationPolicy_local._4_4_ = modelVersion;
  pMStack_18 = interface;
  interface_local = (ModelDescription *)__return_storage_ptr__;
  iVar2 = Specification::ModelDescription::input_size(interface);
  if (iVar2 < 1) {
    if ((local_28->allowsEmptyInput & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Models must have one or more inputs.",&local_49);
      Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      return __return_storage_ptr__;
    }
    if (validationPolicy_local._4_4_ < 9) {
      std::__cxx11::to_string(&local_e0,9);
      std::operator+(&local_c0,"Empty input is only valid in specification verison >= ",&local_e0);
      std::operator+(&local_a0,&local_c0,". This model has version ");
      std::__cxx11::to_string(&local_100,validationPolicy_local._4_4_);
      std::operator+(&local_80,&local_a0,&local_100);
      Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      return __return_storage_ptr__;
    }
  }
  if (((local_28->allowsEmptyOutput & 1U) == 0) &&
     (iVar2 = Specification::ModelDescription::output_size(pMStack_18), iVar2 < 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"Models must have one or more outputs.",
               (allocator<char> *)((long)&__range2 + 7));
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  else {
    pRVar3 = Specification::ModelDescription::input(pMStack_18);
    __end0 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar3);
    input = (FeatureDescription *)
            google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                      (pRVar3);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end0,(iterator *)&input), bVar1) {
      pFVar4 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end0);
      validateFeatureDescription(__return_storage_ptr__,pFVar4,validationPolicy_local._4_4_,INPUT);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      Result::~Result(__return_storage_ptr__);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end0);
    }
    pRVar3 = Specification::ModelDescription::output(pMStack_18);
    __end0_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar3);
    output = (FeatureDescription *)
             google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                       (pRVar3);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end0_1,(iterator *)&output), bVar1) {
      pFVar4 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end0_1);
      validateFeatureDescription(__return_storage_ptr__,pFVar4,validationPolicy_local._4_4_,OUTPUT);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      Result::~Result(__return_storage_ptr__);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end0_1);
    }
    pRVar3 = Specification::ModelDescription::state(pMStack_18);
    __end0_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar3);
    state = (FeatureDescription *)
            google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                      (pRVar3);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end0_2,(iterator *)&state), bVar1) {
      pFVar4 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end0_2);
      validateFeatureDescription(__return_storage_ptr__,pFVar4,validationPolicy_local._4_4_,STATE);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      Result::~Result(__return_storage_ptr__);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end0_2);
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateFeatureDescriptions(const Description& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (interface.input_size() < 1) {
            if (!validationPolicy.allowsEmptyInput) {
                return Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT, "Models must have one or more inputs.");
            }

            if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
                return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                               "Empty input is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                               ". This model has version " + std::to_string(modelVersion));
            }
        }

        if (!validationPolicy.allowsEmptyOutput && interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, FeatureIOType::INPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, FeatureIOType::OUTPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& state : interface.state()) {
            Result r = validateFeatureDescription(state, modelVersion, FeatureIOType::STATE);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }